

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t run_e8e9_filter(rar5 *rar,filter_info *flt,wchar_t extended)

{
  uint8_t uVar1;
  uint32_t offset_00;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  uint32_t naddr;
  uint32_t offset;
  uint32_t addr;
  uint8_t b;
  ssize_t i;
  uint32_t file_size;
  wchar_t extended_local;
  filter_info *flt_local;
  rar5 *rar_local;
  
  circular_memcpy((rar->cstate).filtered_buf,(rar->cstate).window_buf,(rar->cstate).window_mask,
                  (rar->cstate).solid_offset + flt->block_start,
                  (rar->cstate).solid_offset + flt->block_start + flt->block_length);
  _addr = 0;
  lVar4 = _addr;
  while (_addr = lVar4, _addr < flt->block_length + -4) {
    lVar4 = _addr + 1;
    uVar1 = (rar->cstate).window_buf
            [(rar->cstate).solid_offset + flt->block_start + _addr & (rar->cstate).window_mask];
    if ((uVar1 == 0xe8) || ((extended != L'\0' && (uVar1 == 0xe9)))) {
      iVar2 = (int)((lVar4 + flt->block_start) % 0x1000000);
      offset_00 = (uint32_t)lVar4;
      uVar3 = read_filter_data(rar,(int)(rar->cstate).solid_offset + (int)flt->block_start +
                                   offset_00 & (uint)(rar->cstate).window_mask);
      if ((uVar3 & 0x80000000) == 0) {
        if ((uVar3 - 0x1000000 & 0x80000000) != 0) {
          write_filter_data(rar,offset_00,uVar3 - iVar2);
        }
      }
      else if ((uVar3 + iVar2 & 0x80000000) == 0) {
        write_filter_data(rar,offset_00,uVar3 + 0x1000000);
      }
      lVar4 = _addr + 5;
    }
  }
  return L'\0';
}

Assistant:

static int run_e8e9_filter(struct rar5* rar, struct filter_info* flt,
		int extended)
{
	const uint32_t file_size = 0x1000000;
	ssize_t i;

	circular_memcpy(rar->cstate.filtered_buf,
	    rar->cstate.window_buf, rar->cstate.window_mask,
	    rar->cstate.solid_offset + flt->block_start,
	    rar->cstate.solid_offset + flt->block_start + flt->block_length);

	for(i = 0; i < flt->block_length - 4;) {
		uint8_t b = rar->cstate.window_buf[
		    (rar->cstate.solid_offset + flt->block_start +
		    i++) & rar->cstate.window_mask];

		/*
		 * 0xE8 = x86's call <relative_addr_uint32> (function call)
		 * 0xE9 = x86's jmp <relative_addr_uint32> (unconditional jump)
		 */
		if(b == 0xE8 || (extended && b == 0xE9)) {

			uint32_t addr;
			uint32_t offset = (i + flt->block_start) % file_size;

			addr = read_filter_data(rar,
			    (uint32_t)(rar->cstate.solid_offset +
			    flt->block_start + i) & rar->cstate.window_mask);

			if(addr & 0x80000000) {
				if(((addr + offset) & 0x80000000) == 0) {
					write_filter_data(rar, (uint32_t)i,
					    addr + file_size);
				}
			} else {
				if((addr - file_size) & 0x80000000) {
					uint32_t naddr = addr - offset;
					write_filter_data(rar, (uint32_t)i,
					    naddr);
				}
			}

			i += 4;
		}
	}

	return ARCHIVE_OK;
}